

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

CornerIndex __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::GetRightCorner
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          CornerIndex corner_id)

{
  CornerIndex CVar1;
  
  CVar1.value_ = corner_id.value_;
  if (corner_id.value_ != 0xffffffff) {
    CVar1.value_ = corner_id.value_ - 2;
    if (0x55555555 < (corner_id.value_ + 1) * -0x55555555) {
      CVar1.value_ = corner_id.value_ + 1;
    }
  }
  if (CVar1.value_ != 0xffffffff) {
    CVar1.value_ = *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                         super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                         .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                        _M_head_impl)->opposite_corners_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                            + (ulong)CVar1.value_ * 4);
  }
  return (CornerIndex)CVar1.value_;
}

Assistant:

CornerIndex MeshEdgebreakerEncoderImpl<TraversalEncoder>::GetRightCorner(
    CornerIndex corner_id) const {
  const CornerIndex next_corner_id = corner_table_->Next(corner_id);
  return corner_table_->Opposite(next_corner_id);
}